

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

void __thiscall SslTcpSocketImpl::ConEstablished(SslTcpSocketImpl *this,TcpSocketImpl *param_1)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  int iVar2;
  uint uVar3;
  wstring *pwVar4;
  SSL *pSVar5;
  size_t __n;
  long *szBuffer;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  size_t len;
  __array temp;
  unique_lock<std::mutex> lock;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  _Head_base<0UL,_unsigned_char_*,_false> local_b0 [2];
  long local_a0 [2];
  unique_lock<std::mutex> local_90;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_60;
  long *local_50 [2];
  long local_40 [2];
  
  OpenSSLWrapper::SslConnection::SSLSetConnectState
            ((this->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  iVar2 = OpenSSLWrapper::SslConnection::SSLDoHandshake
                    ((this->m_pSslCon)._M_t.
                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  this->m_iSslInit = iVar2;
  if ((0 < iVar2) ||
     (uVar3 = OpenSSLWrapper::SslConnection::SSLGetError
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                         ,iVar2), uVar3 == 2)) goto LAB_0011089c;
  (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iError = uVar3 | 0x80000000;
  (this->super_TcpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xf;
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             (local_80 + 0x10),vswprintf,0x10,L"%d",(ulong)uVar3);
  pwVar4 = (wstring *)
           std::__cxx11::wstring::replace((ulong)(local_80 + 0x10),0,(wchar_t *)0x0,0x134610);
  std::__cxx11::wstring::wstring((wstring *)local_50,pwVar4);
  pwVar4 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_50);
  std::__cxx11::wstring::wstring((wstring *)&local_f0,pwVar4);
  pSVar5 = OpenSSLWrapper::SslConnection::operator()
                     ((this->m_pSslCon)._M_t.
                      super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                      .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_d0,vswprintf,0x20,L"%lu",pSVar5);
  uVar6 = 3;
  if (local_f0 != local_e0) {
    uVar6 = local_e0[0];
  }
  if (uVar6 < local_d0._M_string_length + local_e8) {
    uVar7 = 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar7 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_d0._M_string_length + local_e8) goto LAB_0011076c;
    pwVar4 = (wstring *)
             std::__cxx11::wstring::replace((ulong)&local_d0,0,(wchar_t *)0x0,(ulong)local_f0);
  }
  else {
LAB_0011076c:
    pwVar4 = (wstring *)
             std::__cxx11::wstring::_M_append((wchar_t *)&local_f0,(ulong)local_d0._M_dataplus._M_p)
    ;
  }
  std::__cxx11::wstring::wstring((wstring *)local_b0,pwVar4);
  pwVar4 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_b0);
  std::__cxx11::wstring::wstring((wstring *)&local_90,pwVar4);
  OutputDebugString((wchar_t *)local_90._M_device);
  if (local_90._M_device != (mutex_type *)local_80) {
    operator_delete(local_90._M_device,local_80._0_8_ * 4 + 4);
  }
  if ((long *)local_b0[0]._M_head_impl != local_a0) {
    operator_delete(local_b0[0]._M_head_impl,local_a0[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] * 4 + 4);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_80._16_8_ != &local_60) {
    operator_delete((void *)local_80._16_8_,local_60._M_allocated_capacity * 4 + 4);
  }
  (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])(this);
  if (uVar3 != 2) {
    return;
  }
LAB_0011089c:
  local_90._M_device = &this->m_mxEnDecode;
  local_90._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_90);
  local_90._M_owns = true;
  __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                  ((this->m_pSslCon)._M_t.
                   super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  if (__n == 0) {
    bVar8 = false;
  }
  else {
    __mutex = &(this->super_TcpSocketImpl).m_mxOutDeque;
    bVar8 = false;
    do {
      szBuffer = (long *)operator_new__(__n);
      memset(szBuffer,0,__n);
      local_b0[0]._M_head_impl = (uchar *)szBuffer;
      local_f0 = (ulong *)OpenSSLWrapper::SslConnection::SslGetOutData
                                    ((this->m_pSslCon)._M_t.
                                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                     _M_head_impl,(uint8_t *)szBuffer,__n);
      if (local_f0 != (ulong *)0x0) {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar2 != 0) {
          std::__throw_system_error(iVar2);
        }
        LOCK();
        paVar1 = &(this->super_TcpSocketImpl).m_atOutBytes;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + (long)local_f0;
        UNLOCK();
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                    *)&(this->super_TcpSocketImpl).m_quOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)local_b0,
                   (unsigned_long *)&local_f0);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        bVar8 = true;
      }
      __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
      if ((long *)local_b0[0]._M_head_impl != (long *)0x0) {
        operator_delete__(local_b0[0]._M_head_impl);
      }
    } while (__n != 0);
  }
  std::unique_lock<std::mutex>::unlock(&local_90);
  if (bVar8) {
    TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  return;
}

Assistant:

void SslTcpSocketImpl::ConEstablished(const TcpSocketImpl* const /*pTcpSocket*/)
{
    m_pSslCon->SSLSetConnectState();

    m_iSslInit = m_pSslCon->SSLDoHandshake();
    if (m_iSslInit <= 0)
    {
        const int iError = m_pSslCon->SSLGetError(m_iSslInit);
        if (iError != SSL_ERROR_WANT_READ)
        {
            m_iError = 0x80000000 | iError;
            m_iErrLoc = 15;
            OutputDebugString(wstring(L"SSL_error after SSL_Handshake: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
            Close();
            return;
        }
    }

    bool bNewData = false;
    unique_lock<mutex> lock(m_mxEnDecode);
    size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
    while (nOutDataSize > 0)
    {
        auto temp = make_unique<uint8_t[]>(nOutDataSize);
        size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
        // Schreibt Daten in die SOCKET
        if (len > 0)
        {
            m_mxOutDeque.lock();
            m_atOutBytes += len;
            m_quOutData.emplace_back(move(temp), len);
            m_mxOutDeque.unlock();
            bNewData = true;
        }
        nOutDataSize = m_pSslCon->SslGetOutDataSize();
    }
    lock.unlock();

    if (bNewData == true)
        TriggerWriteThread();
}